

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O0

int DumpPicture(WebPPicture *picture,char *PGM_name)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  size_t sVar6;
  char *in_RSI;
  long in_RDI;
  FILE *f;
  int height;
  int alpha_height;
  uint8_t *src_a;
  uint8_t *src_v;
  uint8_t *src_u;
  uint8_t *src_y;
  int stride;
  int uv_height;
  int uv_width;
  int ok;
  int y;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  void *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  int local_20;
  int local_1c;
  int local_4;
  
  local_20 = 0;
  iVar3 = (*(int *)(in_RDI + 8) + 1) / 2;
  iVar4 = (*(int *)(in_RDI + 0xc) + 1) / 2;
  iVar1 = *(int *)(in_RDI + 8);
  local_38 = *(void **)(in_RDI + 0x10);
  local_40 = *(void **)(in_RDI + 0x18);
  local_48 = *(void **)(in_RDI + 0x20);
  local_50 = *(void **)(in_RDI + 0x30);
  iVar5 = WebPPictureHasTransparency
                    ((WebPPicture *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else {
    iVar5 = *(int *)(in_RDI + 0xc);
  }
  iVar2 = *(int *)(in_RDI + 0xc);
  __stream = fopen(in_RSI,"wb");
  if (__stream == (FILE *)0x0) {
    local_4 = 0;
  }
  else {
    fprintf(__stream,"P5\n%d %d\n255\n",(ulong)(iVar1 + 1U & 0xfffffffe),
            (ulong)(uint)(iVar2 + iVar4 + iVar5));
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0xc); local_1c = local_1c + 1) {
      sVar6 = fwrite(local_38,(long)*(int *)(in_RDI + 8),1,__stream);
      if (sVar6 != 1) goto LAB_00106c42;
      if ((*(uint *)(in_RDI + 8) & 1) != 0) {
        fputc(0,__stream);
      }
      local_38 = (void *)((long)local_38 + (long)*(int *)(in_RDI + 0x28));
    }
    for (local_1c = 0; local_1c < iVar4; local_1c = local_1c + 1) {
      sVar6 = fwrite(local_40,(long)iVar3,1,__stream);
      if ((sVar6 != 1) || (sVar6 = fwrite(local_48,(long)iVar3,1,__stream), sVar6 != 1))
      goto LAB_00106c42;
      local_40 = (void *)((long)local_40 + (long)*(int *)(in_RDI + 0x2c));
      local_48 = (void *)((long)local_48 + (long)*(int *)(in_RDI + 0x2c));
    }
    for (local_1c = 0; local_1c < iVar5; local_1c = local_1c + 1) {
      sVar6 = fwrite(local_50,(long)*(int *)(in_RDI + 8),1,__stream);
      if (sVar6 != 1) goto LAB_00106c42;
      if ((*(uint *)(in_RDI + 8) & 1) != 0) {
        fputc(0,__stream);
      }
      local_50 = (void *)((long)local_50 + (long)*(int *)(in_RDI + 0x38));
    }
    local_20 = 1;
LAB_00106c42:
    fclose(__stream);
    local_4 = local_20;
  }
  return local_4;
}

Assistant:

static int DumpPicture(const WebPPicture* const picture, const char* PGM_name) {
  int y;
  int ok = 0;
  const int uv_width = (picture->width + 1) / 2;
  const int uv_height = (picture->height + 1) / 2;
  const int stride = (picture->width + 1) & ~1;
  const uint8_t* src_y = picture->y;
  const uint8_t* src_u = picture->u;
  const uint8_t* src_v = picture->v;
  const uint8_t* src_a = picture->a;
  const int alpha_height =
      WebPPictureHasTransparency(picture) ? picture->height : 0;
  const int height = picture->height + uv_height + alpha_height;
  FILE* const f = WFOPEN(PGM_name, "wb");
  if (f == NULL) return 0;
  fprintf(f, "P5\n%d %d\n255\n", stride, height);
  for (y = 0; y < picture->height; ++y) {
    if (fwrite(src_y, picture->width, 1, f) != 1) goto Error;
    if (picture->width & 1) fputc(0, f);  // pad
    src_y += picture->y_stride;
  }
  for (y = 0; y < uv_height; ++y) {
    if (fwrite(src_u, uv_width, 1, f) != 1) goto Error;
    if (fwrite(src_v, uv_width, 1, f) != 1) goto Error;
    src_u += picture->uv_stride;
    src_v += picture->uv_stride;
  }
  for (y = 0; y < alpha_height; ++y) {
    if (fwrite(src_a, picture->width, 1, f) != 1) goto Error;
    if (picture->width & 1) fputc(0, f);  // pad
    src_a += picture->a_stride;
  }
  ok = 1;

 Error:
  fclose(f);
  return ok;
}